

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O1

iterator * __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
::erase(iterator *__return_storage_ptr__,
       Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>
       *this,iterator pos)

{
  value_type *pvVar1;
  pointer pcVar2;
  iterator it;
  iterator i;
  
  it.it_ = pos.it_;
  pvVar1 = ((pos.it_.node_)->kv).v_;
  InnerMap::
  iterator_base<google::protobuf::Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Value>::KeyValuePair>
  ::operator++(&pos.it_);
  InnerMap::erase(this->elements_,it.it_);
  if ((pvVar1 != (value_type *)0x0) && (this->arena_ == (Arena *)0x0)) {
    Value::~Value(&pvVar1->second);
    pcVar2 = (pvVar1->first)._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != &(pvVar1->first).field_2) {
      operator_delete(pcVar2);
    }
    operator_delete(pvVar1);
  }
  (__return_storage_ptr__->it_).bucket_index_ = pos.it_.bucket_index_;
  (__return_storage_ptr__->it_).node_ = pos.it_.node_;
  (__return_storage_ptr__->it_).m_ = pos.it_.m_;
  return __return_storage_ptr__;
}

Assistant:

iterator erase(iterator pos) {
    value_type* value = pos.operator->();
    iterator i = pos++;
    elements_->erase(i.it_);
    // Note: we need to delete the value after erasing from the inner map
    // because the inner map's key may be a view of the value's key.
    if (arena_ == nullptr) delete value;
    return pos;
  }